

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

void lj_snap_purge(jit_State *J)

{
  uint maxslot;
  BCReg BVar1;
  ulong uVar2;
  uint8_t udf [255];
  uint8_t auStack_118 [264];
  
  maxslot = J->maxslot;
  BVar1 = snap_usedef(J,auStack_118,J->pc,maxslot);
  if (BVar1 < maxslot) {
    uVar2 = (ulong)BVar1;
    do {
      if (auStack_118[uVar2] != '\0') {
        J->base[uVar2] = 0;
      }
      uVar2 = uVar2 + 1;
    } while (maxslot != uVar2);
  }
  return;
}

Assistant:

void lj_snap_purge(jit_State *J)
{
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg maxslot = J->maxslot;
  BCReg s = snap_usedef(J, udf, J->pc, maxslot);
  for (; s < maxslot; s++)
    if (udf[s] != 0)
      J->base[s] = 0;  /* Purge dead slots. */
}